

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

undefined8 __thiscall gmath::Camera::getCameraKey_abi_cxx11_(Camera *this,char *key,int id)

{
  ostream *poVar1;
  int in_ECX;
  char *in_RDX;
  undefined8 in_RDI;
  ostringstream os;
  ostringstream local_198 [380];
  int local_1c;
  char *local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,"camera.");
  if (-1 < local_1c) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_198,local_1c);
    std::operator<<(poVar1,'.');
  }
  std::operator<<((ostream *)local_198,local_18);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return in_RDI;
}

Assistant:

std::string Camera::getCameraKey(const char *key, int id) const
{
  std::ostringstream os;

  os << "camera.";

  if (id >= 0)
  {
    os << id << '.';
  }

  os << key;

  return os.str();
}